

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 extraout_RAX;
  char *pcVar2;
  int __oflag_00;
  double dVar3;
  string error;
  allocator local_31;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  iVar1 = Writer::open((this->writer_).ptr_,__file,__oflag);
  if (((char)iVar1 != '\0') &&
     (iVar1 = Viterbi::open(this->viterbi_,__file,__oflag_00), (char)iVar1 != '\0')) {
    iVar1 = load_request_type((Param *)__file);
    this->request_type_ = iVar1;
    dVar3 = Param::get<double>((Param *)__file,"theta");
    this->theta_ = dVar3;
    return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                         (this->writer_).ptr_ != (Writer *)0x0 && this->viterbi_ != (Viterbi *)0x0);
  }
  pcVar2 = whatlog::str(&this->viterbi_->what_);
  std::__cxx11::string::string((string *)&local_30,pcVar2,&local_31);
  if (local_28 != 0) {
    std::__cxx11::string::append((char *)&local_30);
  }
  whatlog::str(&((this->writer_).ptr_)->what_);
  std::__cxx11::string::append((char *)&local_30);
  setGlobalError(local_30);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return 0;
}

Assistant:

bool ModelImpl::open(const Param &param) {
  if (!writer_->open(param) || !viterbi_->open(param)) {
    std::string error = viterbi_->what();
    if (!error.empty()) {
      error.append(" ");
    }
    error.append(writer_->what());
    setGlobalError(error.c_str());
    return false;
  }

  request_type_ = load_request_type(param);
  theta_ = param.get<double>("theta");

  return is_available();
}